

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

w_status w_logger_register(w_logger *logger_handle,w_stream stream,w_log_lvl lvl,w_log_fmt fmt)

{
  int iVar1;
  w_status wVar2;
  long lVar3;
  int *piVar4;
  w_status wVar5;
  
  if (logger_handle == (w_logger *)0x0) {
    w_handle_failed_assertion
              ("logger_handle != NULL","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x158);
  }
  if (W_LOG_LVL_ALL < lvl) {
    w_handle_failed_assertion
              ("lvl >= 0 && lvl < WP_LOG_LVL_END","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x159);
  }
  if (W_LOG_FMT_PLAIN_STYLIZED < fmt) {
    w_handle_failed_assertion
              ("fmt >= 0 && fmt < WP_LOG_FMT_END","w_logger_register",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0x15a);
  }
  iVar1 = w_mtx_lock(&wp_log_mtx);
  wVar2 = W_ERROR_LOCK_FAILED;
  if (iVar1 == 0) {
    piVar4 = &wp_log_logger_pool[0].valid;
    lVar3 = 0;
    do {
      if ((*piVar4 == 0) && (*(ushort *)(piVar4 + -1) != 0xffff)) {
        iVar1 = *(ushort *)(piVar4 + -1) + 1;
        *(uint16_t *)(piVar4 + -1) = (uint16_t)iVar1;
        ((wp_log_logger *)(piVar4 + -5))->stream = stream;
        piVar4[-3] = lvl;
        piVar4[-2] = fmt;
        *piVar4 = 1;
        logger_handle->handle = iVar1 * 0x10000 - (int)lVar3;
        wVar5 = W_SUCCESS;
        goto LAB_001043b2;
      }
      lVar3 = lVar3 + -1;
      piVar4 = piVar4 + 6;
    } while (lVar3 != -8);
    wVar5 = W_ERROR_BUF_FULL;
LAB_001043b2:
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    wVar2 = W_ERROR_UNLOCK_FAILED;
    if (iVar1 == 0) {
      wVar2 = wVar5;
    }
  }
  return wVar2;
}

Assistant:

enum w_status
w_logger_register(
    struct w_logger *logger_handle,
    w_stream stream,
    enum w_log_lvl lvl,
    enum w_log_fmt fmt
)
{
    enum w_status status;
    uint16_t i;

    W_ASSERT(logger_handle != NULL);
    W_ASSERT(lvl >= 0 && lvl < WP_LOG_LVL_END);
    W_ASSERT(fmt >= 0 && fmt < WP_LOG_FMT_END);

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        struct wp_log_logger *logger;

        logger = &wp_log_logger_pool[i];

        // Find the first slot available with no valid logger assigned to it.
        if (
            !logger->valid
            && !W_UINT_IS_ADD_WRAPPING(UINT16_MAX, logger->id, 1)
        )
        {
            logger->id += 1;
            logger->stream = stream;
            logger->lvl = lvl;
            logger->fmt = fmt;
            logger->valid = 1;

            logger_handle->handle = WP_LOG_SET_HANDLE(i, logger->id);
            status = W_SUCCESS;
            goto exit;
        }
    }

    status = W_ERROR_BUF_FULL;

exit:
    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}